

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_dist.cpp
# Opt level: O2

Future<double> * __thiscall
Omega_h::Dist::iexch<double>
          (Future<double> *__return_storage_ptr__,Dist *this,Read<double> *data,Int width)

{
  Comm *this_00;
  ScopedTimer exch_timer;
  ScopedTimer local_b9;
  _Any_data local_b8;
  code *local_a8;
  code *local_a0;
  Write<int> local_98;
  Write<int> local_88;
  Write<double> local_78;
  Write<int> local_68;
  Write<double> local_58;
  Write<int> local_48;
  Write<double> local_38;
  
  begin_code("Dist::iexch",(char *)0x0);
  if (this->roots2items_[0].write_.shared_alloc_.direct_ptr != (void *)0x0) {
    Write<double>::Write(&local_38,&data->write_);
    Write<int>::Write(&local_48,&this->roots2items_[0].write_);
    expand<double>((Omega_h *)local_b8._M_pod_data,(Read<signed_char> *)&local_38,(LOs *)&local_48,
                   width);
    Write<double>::operator=(&data->write_,(Write<signed_char> *)&local_b8);
    Write<double>::~Write((Write<double> *)&local_b8);
    Write<int>::~Write(&local_48);
    Write<double>::~Write(&local_38);
  }
  if (this->items2content_[0].write_.shared_alloc_.direct_ptr != (void *)0x0) {
    Write<double>::Write(&local_58,&data->write_);
    Write<int>::Write(&local_68,&this->items2content_[0].write_);
    permute<double>((Omega_h *)local_b8._M_pod_data,(Read<signed_char> *)&local_58,(LOs *)&local_68,
                    width);
    Write<double>::operator=(&data->write_,(Write<signed_char> *)&local_b8);
    Write<double>::~Write((Write<double> *)&local_b8);
    Write<int>::~Write(&local_68);
    Write<double>::~Write(&local_58);
  }
  this_00 = this->comm_[0].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Write<double>::Write(&local_78,&data->write_);
  Write<int>::Write(&local_88,&this->msgs2content_[0].write_);
  Write<int>::Write(&local_98,&this->msgs2content_[1].write_);
  Comm::ialltoallv<double>
            (__return_storage_ptr__,this_00,(Read<double> *)&local_78,(Read<int> *)&local_88,
             (Read<int> *)&local_98,width);
  Write<int>::~Write(&local_98);
  Write<int>::~Write(&local_88);
  Write<double>::~Write(&local_78);
  local_b8._12_4_ = 0;
  local_b8._8_4_ = width;
  local_a0 = std::
             _Function_handler<Omega_h::Read<double>_(Omega_h::Read<double>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_dist.cpp:135:19)>
             ::_M_invoke;
  local_a8 = std::
             _Function_handler<Omega_h::Read<double>_(Omega_h::Read<double>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_dist.cpp:135:19)>
             ::_M_manager;
  local_b8._M_unused._M_object = this;
  Future<double>::add_callback(__return_storage_ptr__,(additional_callback_type *)&local_b8);
  std::_Function_base::~_Function_base((_Function_base *)&local_b8);
  ScopedTimer::~ScopedTimer(&local_b9);
  return __return_storage_ptr__;
}

Assistant:

Future<T> Dist::iexch(Read<T> data, Int width) const {
  ScopedTimer exch_timer("Dist::iexch");
  if (roots2items_[F].exists()) {
    data = expand(data, roots2items_[F], width);
  }
  if (items2content_[F].exists()) {
    data = permute(data, items2content_[F], width);
  }
  auto future = comm_[F]->ialltoallv(data, msgs2content_[F], msgs2content_[R], width);
  auto callback = [this,width](Read<T> buf) {
    if (this->items2content_[R].exists()) {
      buf = unmap(this->items2content_[R], buf, width);
    }
    return buf;
  };
  future.add_callback(callback);
  return future;
}